

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# default_value_objectwriter.cc
# Opt level: O2

DefaultValueObjectWriter * __thiscall
google::protobuf::util::converter::DefaultValueObjectWriter::RenderBytes
          (DefaultValueObjectWriter *this,StringPiece name,StringPiece value)

{
  string *__return_storage_ptr__;
  DataPiece local_78;
  StringPiece local_50;
  undefined1 local_40 [8];
  StringPiece value_local;
  
  value_local.ptr_ = (char *)value.length_;
  local_40 = (undefined1  [8])value.ptr_;
  if (this->current_ == (Node *)0x0) {
    (*this->ow_->_vptr_ObjectWriter[0xe])(this->ow_,name.ptr_,name.length_);
  }
  else {
    __return_storage_ptr__ = (string *)operator_new(0x20);
    StringPiece::ToString_abi_cxx11_(__return_storage_ptr__,(StringPiece *)local_40);
    local_78._vptr_DataPiece = (_func_int **)__return_storage_ptr__;
    std::
    vector<std::unique_ptr<std::__cxx11::string,std::default_delete<std::__cxx11::string>>,std::allocator<std::unique_ptr<std::__cxx11::string,std::default_delete<std::__cxx11::string>>>>
    ::emplace_back<std::__cxx11::string*>
              ((vector<std::unique_ptr<std::__cxx11::string,std::default_delete<std::__cxx11::string>>,std::allocator<std::unique_ptr<std::__cxx11::string,std::default_delete<std::__cxx11::string>>>>
                *)&this->string_values_,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)&local_78);
    StringPiece::StringPiece<std::allocator<char>>
              (&local_50,
               (this->string_values_).
               super__Vector_base<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
               super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               ._M_head_impl);
    local_78._vptr_DataPiece = (_func_int **)&PTR__DataPiece_003e3c20;
    local_78.type_ = TYPE_BYTES;
    local_78.field_2.i64_ = (int64)local_50.ptr_;
    local_78.field_2.str_.size_ = local_50.length_;
    local_78.use_strict_base64_decoding_ = true;
    RenderDataPiece(this,name,&local_78);
  }
  return this;
}

Assistant:

DefaultValueObjectWriter* DefaultValueObjectWriter::RenderBytes(
    StringPiece name, StringPiece value) {
  if (current_ == nullptr) {
    ow_->RenderBytes(name, value);
  } else {
    // Since StringPiece is essentially a pointer, takes a copy of "value" to
    // avoid ownership issues.
    string_values_.emplace_back(new std::string(value));
    RenderDataPiece(name, DataPiece(*string_values_.back(), false, true));
  }
  return this;
}